

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<spvc_reflected_resource,_8UL>::reserve
          (SmallVector<spvc_reflected_resource,_8UL> *this,size_t count)

{
  spvc_type_id sVar1;
  undefined4 uVar2;
  size_t sVar3;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  spvc_reflected_resource *psVar6;
  spvc_reflected_resource *psVar7;
  spvc_reflected_resource *local_58;
  ulong local_38;
  size_t i;
  spvc_reflected_resource *new_buffer;
  unsigned_long local_20;
  size_t target_capacity;
  size_t count_local;
  SmallVector<spvc_reflected_resource,_8UL> *this_local;
  
  target_capacity = count;
  count_local = (size_t)this;
  uVar4 = ::std::numeric_limits<unsigned_long>::max();
  sVar3 = target_capacity;
  if ((uVar4 / 0x18 < count) ||
     (uVar4 = ::std::numeric_limits<unsigned_long>::max(), uVar4 >> 1 < sVar3)) {
    ::std::terminate();
  }
  if (this->buffer_capacity < target_capacity) {
    local_20 = this->buffer_capacity;
    if (local_20 == 0) {
      local_20 = 1;
    }
    new_buffer = (spvc_reflected_resource *)0x8;
    puVar5 = ::std::max<unsigned_long>(&local_20,(unsigned_long *)&new_buffer);
    for (local_20 = *puVar5; local_20 < target_capacity; local_20 = local_20 << 1) {
    }
    if (local_20 < 9) {
      local_58 = AlignedBuffer<spvc_reflected_resource,_8UL>::data(&this->stack_storage);
    }
    else {
      local_58 = (spvc_reflected_resource *)malloc(local_20 * 0x18);
    }
    if (local_58 == (spvc_reflected_resource *)0x0) {
      ::std::terminate();
    }
    if (local_58 != (this->super_VectorView<spvc_reflected_resource>).ptr) {
      for (local_38 = 0; local_38 < (this->super_VectorView<spvc_reflected_resource>).buffer_size;
          local_38 = local_38 + 1) {
        psVar6 = local_58 + local_38;
        psVar7 = (this->super_VectorView<spvc_reflected_resource>).ptr + local_38;
        sVar1 = psVar7->base_type_id;
        psVar6->id = psVar7->id;
        psVar6->base_type_id = sVar1;
        uVar2 = *(undefined4 *)&psVar7->field_0xc;
        psVar6->type_id = psVar7->type_id;
        *(undefined4 *)&psVar6->field_0xc = uVar2;
        psVar6->name = psVar7->name;
      }
    }
    psVar6 = (this->super_VectorView<spvc_reflected_resource>).ptr;
    psVar7 = AlignedBuffer<spvc_reflected_resource,_8UL>::data(&this->stack_storage);
    if (psVar6 != psVar7) {
      free((this->super_VectorView<spvc_reflected_resource>).ptr);
    }
    (this->super_VectorView<spvc_reflected_resource>).ptr = local_58;
    this->buffer_capacity = local_20;
  }
  return;
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}